

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureVkImpl.cpp
# Opt level: O3

void __thiscall
Diligent::PipelineResourceSignatureVkImpl::CopyStaticResources
          (PipelineResourceSignatureVkImpl *this,ShaderResourceCacheVk *DstResourceCache)

{
  ushort uVar1;
  ushort uVar2;
  ShaderResourceCacheVk *this_00;
  IDeviceObject *pIVar3;
  IDeviceObject *pIVar4;
  VulkanLogicalDevice *pLogicalDevice;
  PipelineResourceDesc *pPVar5;
  PipelineResourceAttribsType *pPVar6;
  Resource *pRVar7;
  Resource *pRVar8;
  RenderDeviceVkImpl *pRVar9;
  char *Args_1;
  uint CacheOffset;
  PipelineResourceSignatureDesc *in_R8;
  Uint32 UVar10;
  string msg;
  uint in_stack_ffffffffffffff38;
  Uint32 in_stack_ffffffffffffff3c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  ShaderResourceCacheVk *local_a8;
  PipelineResourceDesc *local_a0;
  PipelineResourceAttribsType *local_98;
  uint local_8c;
  Uint32 local_88;
  uint local_84;
  PipelineResourceSignatureDesc *local_80;
  PipelineResourceSignatureVkImpl *local_78;
  long local_70;
  DescriptorSet *local_68;
  long local_60;
  DescriptorSet *local_58;
  String local_50;
  
  if (((this->m_VkDescrSetLayouts)._M_elems[0].m_VkObject != (VkDescriptorSetLayout_T *)0x0) &&
     (this_00 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                m_pStaticResCache, this_00 != (ShaderResourceCacheVk *)0x0)) {
    local_a8 = DstResourceCache;
    GetDescriptorSetIndex<(Diligent::PipelineResourceSignatureVkImpl::DESCRIPTOR_SET_ID)0>(this);
    local_58 = ShaderResourceCacheVk::GetDescriptorSet(this_00,0);
    local_68 = ShaderResourceCacheVk::GetDescriptorSet(local_a8,0);
    uVar1 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
            m_ResourceOffsets._M_elems[0];
    UVar10 = (Uint32)uVar1;
    uVar2 = (this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
            m_ResourceOffsets._M_elems[1];
    local_8c = (uint)uVar2;
    if (uVar1 < uVar2) {
      local_84 = *(uint *)&local_a8->field_0x1c;
      Args_1 = (char *)(ulong)local_84;
      local_60 = (ulong)(~*(uint *)&this_00->field_0x1c >> 0x1f) * 4 + 8;
      local_70 = (ulong)(~local_84 >> 0x1f) * 4 + 8;
      local_80 = &(this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>).
                  super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                  .m_Desc;
      local_78 = this;
      do {
        pPVar5 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceDesc
                           (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                            ,UVar10);
        pPVar6 = PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::GetResourceAttribs
                           (&this->super_PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>
                            ,UVar10);
        local_a0 = pPVar5;
        if (pPVar5->VarType != SHADER_RESOURCE_VARIABLE_TYPE_STATIC) {
          FormatString<char[26],char[56]>
                    ((string *)&stack0xffffffffffffff38,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC",
                     (char (*) [56])Args_1);
          Args_1 = (char *)0x227;
          DebugAssertionFailed
                    ((Char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                     "CopyStaticResources",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                     ,0x227);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38) != &local_b8) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                            local_b8._M_allocated_capacity + 1);
          }
        }
        local_88 = UVar10;
        if (((local_a0->ResourceType != SHADER_RESOURCE_TYPE_SAMPLER) || (-1 < *(long *)pPVar6)) &&
           (local_a0->ArraySize != 0)) {
          UVar10 = 0;
          local_98 = pPVar6;
          do {
            pRVar7 = ShaderResourceCacheVk::DescriptorSet::GetResource
                               (local_58,*(int *)((long)&pPVar6->field_0x0 + local_60) + UVar10);
            pIVar3 = (pRVar7->pObject).m_pObject;
            if (pIVar3 == (IDeviceObject *)0x0) {
              if ((int)local_84 < 0) {
                GetShaderResourcePrintName_abi_cxx11_
                          (&local_50,(Diligent *)local_a0->Name,(char *)(ulong)local_a0->ArraySize,
                           UVar10,(Uint32)in_R8);
                Args_1 = "\' in pipeline resource signature \'";
                in_R8 = local_80;
                FormatString<char[52],std::__cxx11::string,char[35],char_const*,char[3]>
                          ((string *)&stack0xffffffffffffff38,
                           (Diligent *)"No resource is assigned to static shader variable \'",
                           (char (*) [52])&local_50,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "\' in pipeline resource signature \'",(char (*) [35])local_80,
                           (char **)"\'.",
                           (char (*) [3])
                           CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_50._M_dataplus._M_p != &local_50.field_2) {
                  operator_delete(local_50._M_dataplus._M_p,
                                  local_50.field_2._M_allocated_capacity + 1);
                }
                if (DebugMessageCallback != (undefined *)0x0) {
                  Args_1 = (char *)0x0;
                  in_R8 = (PipelineResourceSignatureDesc *)0x0;
                  (*(code *)DebugMessageCallback)
                            (2,CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),0);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38) != &local_b8) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                  local_b8._M_allocated_capacity + 1);
                }
              }
            }
            else {
              CacheOffset = *(int *)((long)&pPVar6->field_0x0 + local_70) + UVar10;
              pRVar8 = ShaderResourceCacheVk::DescriptorSet::GetResource(local_68,CacheOffset);
              if (pRVar7->Type != pRVar8->Type) {
                FormatString<char[26],char[39]>
                          ((string *)&stack0xffffffffffffff38,
                           (Diligent *)"Debug expression failed:\n",
                           (char (*) [26])"SrcCachedRes.Type == DstCachedRes.Type",
                           (char (*) [39])Args_1);
                Args_1 = (char *)0x23a;
                DebugAssertionFailed
                          ((Char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                           "CopyStaticResources",
                           "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                           ,0x23a);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38) != &local_b8) {
                  operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                                  local_b8._M_allocated_capacity + 1);
                }
              }
              pIVar4 = (pRVar8->pObject).m_pObject;
              pPVar6 = local_98;
              if (pIVar4 != pIVar3) {
                if (pIVar4 != (IDeviceObject *)0x0) {
                  FormatString<char[111]>
                            ((string *)&stack0xffffffffffffff38,
                             (char (*) [111])
                             "Static resource has already been initialized, and the new resource does not match previously assigned resource"
                            );
                  DebugAssertionFailed
                            ((Char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                             "CopyStaticResources",
                             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineResourceSignatureVkImpl.cpp"
                             ,0x23f);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38) != &local_b8)
                  {
                    operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38)
                                    ,local_b8._M_allocated_capacity + 1);
                  }
                }
                pRVar9 = DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                         ::GetDevice((DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                                      *)this);
                pLogicalDevice =
                     (pRVar9->m_LogicalVkDevice).
                     super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
                uVar1 = *(ushort *)local_98;
                pIVar3 = (pRVar7->pObject).m_pObject;
                if (pIVar3 != (IDeviceObject *)0x0) {
                  (*(pIVar3->super_IObject)._vptr_IObject[1])(pIVar3);
                }
                in_stack_ffffffffffffff38 = (uint)uVar1;
                local_b8._M_allocated_capacity = pRVar7->BufferBaseOffset;
                local_b8._8_8_ = pRVar7->BufferRangeSize;
                Args_1 = (char *)(ulong)CacheOffset;
                in_R8 = (PipelineResourceSignatureDesc *)&stack0xffffffffffffff38;
                in_stack_ffffffffffffff3c = UVar10;
                ShaderResourceCacheVk::SetResource
                          (local_a8,pLogicalDevice,0,CacheOffset,
                           (SetResourceInfo *)&stack0xffffffffffffff38);
                this = local_78;
                pPVar6 = local_98;
                if (pIVar3 != (IDeviceObject *)0x0) {
                  (*(pIVar3->super_IObject)._vptr_IObject[2])();
                }
              }
            }
            UVar10 = UVar10 + 1;
          } while (UVar10 < local_a0->ArraySize);
        }
        UVar10 = local_88 + 1;
      } while (UVar10 != local_8c);
    }
    ShaderResourceCacheVk::DbgVerifyDynamicBuffersCounter(local_a8);
  }
  return;
}

Assistant:

void PipelineResourceSignatureVkImpl::CopyStaticResources(ShaderResourceCacheVk& DstResourceCache) const
{
    if (!HasDescriptorSet(DESCRIPTOR_SET_ID_STATIC_MUTABLE) || m_pStaticResCache == nullptr)
        return;

    // SrcResourceCache contains only static resources.
    // In case of SRB, DstResourceCache contains static, mutable and dynamic resources.
    // In case of Signature, DstResourceCache contains only static resources.
    const auto& SrcResourceCache = *m_pStaticResCache;
    const auto  StaticSetIdx     = GetDescriptorSetIndex<DESCRIPTOR_SET_ID_STATIC_MUTABLE>();
    const auto& SrcDescrSet      = SrcResourceCache.GetDescriptorSet(StaticSetIdx);
    const auto& DstDescrSet      = const_cast<const ShaderResourceCacheVk&>(DstResourceCache).GetDescriptorSet(StaticSetIdx);
    const auto  ResIdxRange      = GetResourceIndexRange(SHADER_RESOURCE_VARIABLE_TYPE_STATIC);
    const auto  SrcCacheType     = SrcResourceCache.GetContentType();
    const auto  DstCacheType     = DstResourceCache.GetContentType();

    for (Uint32 r = ResIdxRange.first; r < ResIdxRange.second; ++r)
    {
        const auto& ResDesc = GetResourceDesc(r);
        const auto& Attr    = GetResourceAttribs(r);
        VERIFY_EXPR(ResDesc.VarType == SHADER_RESOURCE_VARIABLE_TYPE_STATIC);

        if (ResDesc.ResourceType == SHADER_RESOURCE_TYPE_SAMPLER && Attr.IsImmutableSamplerAssigned())
            continue; // Skip immutable separate samplers

        for (Uint32 ArrInd = 0; ArrInd < ResDesc.ArraySize; ++ArrInd)
        {
            const auto     SrcCacheOffset = Attr.CacheOffset(SrcCacheType) + ArrInd;
            const auto&    SrcCachedRes   = SrcDescrSet.GetResource(SrcCacheOffset);
            IDeviceObject* pObject        = SrcCachedRes.pObject;
            if (pObject == nullptr)
            {
                if (DstCacheType == ResourceCacheContentType::SRB)
                    LOG_ERROR_MESSAGE("No resource is assigned to static shader variable '", GetShaderResourcePrintName(ResDesc, ArrInd), "' in pipeline resource signature '", m_Desc.Name, "'.");
                continue;
            }

            const auto  DstCacheOffset = Attr.CacheOffset(DstCacheType) + ArrInd;
            const auto& DstCachedRes   = DstDescrSet.GetResource(DstCacheOffset);
            VERIFY_EXPR(SrcCachedRes.Type == DstCachedRes.Type);

            const IDeviceObject* pCachedResource = DstCachedRes.pObject;
            if (pCachedResource != pObject)
            {
                DEV_CHECK_ERR(pCachedResource == nullptr, "Static resource has already been initialized, and the new resource does not match previously assigned resource");
                DstResourceCache.SetResource(&GetDevice()->GetLogicalDevice(),
                                             StaticSetIdx,
                                             DstCacheOffset,
                                             {
                                                 Attr.BindingIndex,
                                                 ArrInd,
                                                 RefCntAutoPtr<IDeviceObject>{SrcCachedRes.pObject},
                                                 SrcCachedRes.BufferBaseOffset,
                                                 SrcCachedRes.BufferRangeSize //
                                             });
            }
        }
    }

#ifdef DILIGENT_DEBUG
    DstResourceCache.DbgVerifyDynamicBuffersCounter();
#endif
}